

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

opStatus __thiscall llvm::detail::DoubleAPFloat::mod(DoubleAPFloat *this,DoubleAPFloat *RHS)

{
  opStatus oVar1;
  APFloat Tmp;
  APFloat local_80;
  DoubleAPFloat local_60;
  APFloat local_50;
  
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    bitcastToAPInt((DoubleAPFloat *)&local_80);
    IEEEFloat::IEEEFloat
              (&local_50.U.IEEE,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)&local_80);
    APInt::~APInt((APInt *)&local_80);
    bitcastToAPInt(&local_60);
    IEEEFloat::IEEEFloat
              (&local_80.U.IEEE,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)&local_60);
    oVar1 = APFloat::mod(&local_50,&local_80);
    APFloat::Storage::~Storage((Storage *)&local_80.U.IEEE);
    APInt::~APInt((APInt *)&local_60);
    APFloat::bitcastToAPInt((APFloat *)&local_60);
    DoubleAPFloat((DoubleAPFloat *)&local_80,(fltSemantics *)semPPCDoubleDouble,(APInt *)&local_60);
    operator=(this,(DoubleAPFloat *)&local_80);
    std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::~unique_ptr
              ((unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_> *)
               &local_80.U.IEEE);
    APInt::~APInt((APInt *)&local_60);
    APFloat::Storage::~Storage((Storage *)&local_50.U.IEEE);
    return oVar1;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x103d,"APFloat::opStatus llvm::detail::DoubleAPFloat::mod(const DoubleAPFloat &)")
  ;
}

Assistant:

APFloat::opStatus DoubleAPFloat::mod(const DoubleAPFloat &RHS) {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat Tmp(semPPCDoubleDoubleLegacy, bitcastToAPInt());
  auto Ret = Tmp.mod(APFloat(semPPCDoubleDoubleLegacy, RHS.bitcastToAPInt()));
  *this = DoubleAPFloat(semPPCDoubleDouble, Tmp.bitcastToAPInt());
  return Ret;
}